

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

int sexp_param_index(sexp ctx,sexp lambda,sexp name)

{
  int *in_RDX;
  long in_RSI;
  sexp in_RDI;
  bool bVar1;
  sexp unaff_retaddr;
  int i;
  sexp ls;
  int local_2c;
  int *local_28;
  int *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_20 = in_RDX;
  while( true ) {
    local_28 = *(int **)(in_RSI + 0x10);
    local_2c = 0;
    while( true ) {
      bVar1 = false;
      if (((ulong)local_28 & 3) == 0) {
        bVar1 = *local_28 == 6;
      }
      if (!bVar1) break;
      if (*(int **)(local_28 + 2) == local_20) {
        return local_2c;
      }
      local_28 = *(int **)(local_28 + 4);
      local_2c = local_2c + 1;
    }
    if (local_28 == local_20) {
      return local_2c;
    }
    local_28 = *(int **)(in_RSI + 0x28);
    local_2c = -1;
    while( true ) {
      bVar1 = false;
      if (((ulong)local_28 & 3) == 0) {
        bVar1 = *local_28 == 6;
      }
      if (!bVar1) break;
      if (*(int **)(local_28 + 2) == local_20) {
        return local_2c + -4;
      }
      local_28 = *(int **)(local_28 + 4);
      local_2c = local_2c + -1;
    }
    if ((((ulong)local_20 & 3) != 0) || (*local_20 != 0x16)) break;
    local_20 = *(int **)(local_20 + 6);
  }
  sexp_warn(unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            in_RDI);
  return -10000;
}

Assistant:

int sexp_param_index (sexp ctx, sexp lambda, sexp name) {
  sexp ls;
  int i;
  while (1) {
    ls = sexp_lambda_params(lambda);
    for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++)
      if (sexp_car(ls) == name)
        return i;
    if (ls == name)
      return i;
    ls = sexp_lambda_locals(lambda);
    for (i=-1; sexp_pairp(ls); ls=sexp_cdr(ls), i--)
      if (sexp_car(ls) == name)
        return i-4;
    if (sexp_synclop(name))
      name = sexp_synclo_expr(name);
    else
      break;
  }
  sexp_warn(ctx, "can't happen: no argument: ", name);
  return -10000;
}